

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_socket_peer_id(nng_socket id,uint16_t *idp)

{
  uint16_t uVar1;
  nni_sock *local_28;
  nni_sock *sock;
  uint16_t *puStack_18;
  int rv;
  uint16_t *idp_local;
  nng_socket id_local;
  
  puStack_18 = idp;
  idp_local._0_4_ = id.id;
  sock._4_4_ = nni_sock_find(&local_28,id.id);
  idp_local._4_4_ = sock._4_4_;
  if (sock._4_4_ == 0) {
    uVar1 = nni_sock_peer_id(local_28);
    *puStack_18 = uVar1;
    nni_sock_rele(local_28);
    idp_local._4_4_ = 0;
  }
  return idp_local._4_4_;
}

Assistant:

int
nng_socket_peer_id(nng_socket id, uint16_t *idp)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, id.id)) != 0) {
		return (rv);
	}

	*idp = nni_sock_peer_id(sock);
	nni_sock_rele(sock);
	return (0);
}